

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

uint * Kit_DsdTruthComputeNodeOne_rec(Kit_DsdMan_t *p,Kit_DsdNtk_t *pNtk,int Id,uint uSupp)

{
  ushort uVar1;
  uint *pIn1;
  CloudManager *dd;
  bool bVar2;
  int iVar3;
  uint uVar4;
  Kit_DsdObj_t *pObj_00;
  uint *puVar5;
  uint local_cc;
  uint nPartial;
  uint fCompl;
  uint iLit;
  uint i;
  uint *pTruthTemp;
  uint *pTruthFans [16];
  uint *pTruthRes;
  Kit_DsdObj_t *pObj;
  uint uSupp_local;
  int Id_local;
  Kit_DsdNtk_t *pNtk_local;
  Kit_DsdMan_t *p_local;
  
  bVar2 = false;
  pObj_00 = Kit_DsdNtkObj(pNtk,Id);
  p_local = (Kit_DsdMan_t *)Vec_PtrEntry(p->vTtNodes,Id);
  pTruthFans[0xf] = (uint *)p_local;
  if (pObj_00 == (Kit_DsdObj_t *)0x0) {
    if ((int)(uint)pNtk->nVars <= Id) {
      __assert_fail("Id < pNtk->nVars",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                    ,0x2c1,
                    "unsigned int *Kit_DsdTruthComputeNodeOne_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int)"
                   );
    }
    if ((uSupp != 0) && (uSupp == (uSupp & (1 << ((byte)Id & 0x1f) ^ 0xffffffffU)))) {
      __assert_fail("!uSupp || uSupp != (uSupp & ~(1<<Id))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                    ,0x2c2,
                    "unsigned int *Kit_DsdTruthComputeNodeOne_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int)"
                   );
    }
  }
  else if (((uint)*pObj_00 >> 6 & 7) == 1) {
    if ((uint)*pObj_00 >> 0x1a != 0) {
      __assert_fail("pObj->nFans == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                    ,0x2c9,
                    "unsigned int *Kit_DsdTruthComputeNodeOne_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int)"
                   );
    }
    Kit_TruthFill((uint *)p_local,(uint)pNtk->nVars);
    p_local = (Kit_DsdMan_t *)pTruthFans[0xf];
  }
  else if (((uint)*pObj_00 >> 6 & 7) == 2) {
    if ((uint)*pObj_00 >> 0x1a != 1) {
      __assert_fail("pObj->nFans == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                    ,0x2d1,
                    "unsigned int *Kit_DsdTruthComputeNodeOne_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int)"
                   );
    }
    uVar4 = (uint)*(ushort *)(pObj_00 + 1);
    iVar3 = Kit_DsdLitIsLeaf(pNtk,uVar4);
    if (iVar3 == 0) {
      __assert_fail("Kit_DsdLitIsLeaf( pNtk, iLit )",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                    ,0x2d3,
                    "unsigned int *Kit_DsdTruthComputeNodeOne_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int)"
                   );
    }
    iVar3 = Abc_Lit2Var(uVar4);
    pTruthTemp = Kit_DsdTruthComputeNodeOne_rec(p,pNtk,iVar3,uSupp);
    iVar3 = Abc_LitIsCompl(uVar4);
    if (iVar3 == 0) {
      Kit_TruthCopy(pTruthFans[0xf],pTruthTemp,(uint)pNtk->nVars);
    }
    else {
      Kit_TruthNot(pTruthFans[0xf],pTruthTemp,(uint)pNtk->nVars);
    }
    p_local = (Kit_DsdMan_t *)pTruthFans[0xf];
  }
  else {
    if (uSupp == 0) {
      for (fCompl = 0; fCompl < (uint)*pObj_00 >> 0x1a; fCompl = fCompl + 1) {
        iVar3 = Abc_Lit2Var((uint)*(ushort *)(&pObj_00[1].field_0x0 + (ulong)fCompl * 2));
        puVar5 = Kit_DsdTruthComputeNodeOne_rec(p,pNtk,iVar3,0);
        pTruthFans[(ulong)fCompl - 1] = puVar5;
      }
    }
    else {
      for (fCompl = 0; fCompl < (uint)*pObj_00 >> 0x1a; fCompl = fCompl + 1) {
        uVar1 = *(ushort *)(&pObj_00[1].field_0x0 + (ulong)fCompl * 2);
        uVar4 = Kit_DsdLitSupport(pNtk,(uint)uVar1);
        if (uSupp == (uSupp & (uVar4 ^ 0xffffffff))) {
          pTruthFans[(ulong)fCompl - 1] = (uint *)0x0;
          bVar2 = true;
        }
        else {
          iVar3 = Abc_Lit2Var((uint)uVar1);
          puVar5 = Kit_DsdTruthComputeNodeOne_rec(p,pNtk,iVar3,uSupp);
          pTruthFans[(ulong)fCompl - 1] = puVar5;
        }
      }
    }
    if (((uint)*pObj_00 >> 6 & 7) == 3) {
      Kit_TruthFill(pTruthFans[0xf],(uint)pNtk->nVars);
      for (fCompl = 0; puVar5 = pTruthFans[0xf], fCompl < (uint)*pObj_00 >> 0x1a;
          fCompl = fCompl + 1) {
        if (pTruthFans[(ulong)fCompl - 1] != (uint *)0x0) {
          pIn1 = pTruthFans[(ulong)fCompl - 1];
          uVar1 = pNtk->nVars;
          iVar3 = Abc_LitIsCompl((uint)*(ushort *)(&pObj_00[1].field_0x0 + (ulong)fCompl * 2));
          Kit_TruthAndPhase(puVar5,puVar5,pIn1,(uint)uVar1,0,iVar3);
        }
      }
      p_local = (Kit_DsdMan_t *)pTruthFans[0xf];
    }
    else if (((uint)*pObj_00 >> 6 & 7) == 4) {
      Kit_TruthClear(pTruthFans[0xf],(uint)pNtk->nVars);
      local_cc = 0;
      for (fCompl = 0; fCompl < (uint)*pObj_00 >> 0x1a; fCompl = fCompl + 1) {
        uVar1 = *(ushort *)(&pObj_00[1].field_0x0 + (ulong)fCompl * 2);
        if (pTruthFans[(ulong)fCompl - 1] != (uint *)0x0) {
          Kit_TruthXor(pTruthFans[0xf],pTruthFans[0xf],pTruthFans[(ulong)fCompl - 1],
                       (uint)pNtk->nVars);
          uVar4 = Abc_LitIsCompl((uint)uVar1);
          local_cc = uVar4 ^ local_cc;
        }
      }
      if (local_cc != 0) {
        Kit_TruthNot(pTruthFans[0xf],pTruthFans[0xf],(uint)pNtk->nVars);
      }
      p_local = (Kit_DsdMan_t *)pTruthFans[0xf];
    }
    else {
      if (((uint)*pObj_00 >> 6 & 7) != 5) {
        __assert_fail("pObj->Type == KIT_DSD_PRIME",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                      ,0x308,
                      "unsigned int *Kit_DsdTruthComputeNodeOne_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int)"
                     );
      }
      if ((uSupp == 0) || (!bVar2)) {
        for (fCompl = 0; fCompl < (uint)*pObj_00 >> 0x1a; fCompl = fCompl + 1) {
          iVar3 = Abc_LitIsCompl((uint)*(ushort *)(&pObj_00[1].field_0x0 + (ulong)fCompl * 2));
          if (iVar3 != 0) {
            Kit_TruthNot(pTruthFans[(ulong)fCompl - 1],pTruthFans[(ulong)fCompl - 1],
                         (uint)pNtk->nVars);
          }
        }
        dd = p->dd;
        puVar5 = Kit_DsdObjTruth(pObj_00);
        puVar5 = Kit_TruthCompose(dd,puVar5,(uint)*pObj_00 >> 0x1a,&pTruthTemp,(uint)pNtk->nVars,
                                  p->vTtBdds,p->vNodes);
        Kit_TruthCopy(pTruthFans[0xf],puVar5,(uint)pNtk->nVars);
        p_local = (Kit_DsdMan_t *)pTruthFans[0xf];
      }
      else {
        fCompl = 0;
        while ((fCompl < (uint)*pObj_00 >> 0x1a && (pTruthFans[(ulong)fCompl - 1] == (uint *)0x0)))
        {
          fCompl = fCompl + 1;
        }
        if ((uint)*pObj_00 >> 0x1a <= fCompl) {
          __assert_fail("i < pObj->nFans",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitDsd.c"
                        ,0x310,
                        "unsigned int *Kit_DsdTruthComputeNodeOne_rec(Kit_DsdMan_t *, Kit_DsdNtk_t *, int, unsigned int)"
                       );
        }
        p_local = (Kit_DsdMan_t *)pTruthFans[(ulong)fCompl - 1];
      }
    }
  }
  return (uint *)p_local;
}

Assistant:

unsigned * Kit_DsdTruthComputeNodeOne_rec( Kit_DsdMan_t * p, Kit_DsdNtk_t * pNtk, int Id, unsigned uSupp )
{
    Kit_DsdObj_t * pObj;
    unsigned * pTruthRes, * pTruthFans[16], * pTruthTemp;
    unsigned i, iLit, fCompl, nPartial = 0;
//    unsigned m, nMints, * pTruthPrime, * pTruthMint; 

    // get the node with this ID
    pObj = Kit_DsdNtkObj( pNtk, Id );
    pTruthRes = (unsigned *)Vec_PtrEntry( p->vTtNodes, Id );

    // special case: literal of an internal node
    if ( pObj == NULL )
    {
        assert( Id < pNtk->nVars );
        assert( !uSupp || uSupp != (uSupp & ~(1<<Id)) );
        return pTruthRes;
    }

    // constant node
    if ( pObj->Type == KIT_DSD_CONST1 )
    {
        assert( pObj->nFans == 0 );
        Kit_TruthFill( pTruthRes, pNtk->nVars );
        return pTruthRes;
    }

    // elementary variable node
    if ( pObj->Type == KIT_DSD_VAR )
    {
        assert( pObj->nFans == 1 );
        iLit = pObj->pFans[0];
        assert( Kit_DsdLitIsLeaf( pNtk, iLit ) );
        pTruthFans[0] = Kit_DsdTruthComputeNodeOne_rec( p, pNtk, Abc_Lit2Var(iLit), uSupp );
        if ( Abc_LitIsCompl(iLit) )
            Kit_TruthNot( pTruthRes, pTruthFans[0], pNtk->nVars );
        else
            Kit_TruthCopy( pTruthRes, pTruthFans[0], pNtk->nVars );
        return pTruthRes;
    }

    // collect the truth tables of the fanins
    if ( uSupp )
    {
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            if ( uSupp != (uSupp & ~Kit_DsdLitSupport(pNtk, iLit)) )
                pTruthFans[i] = Kit_DsdTruthComputeNodeOne_rec( p, pNtk, Abc_Lit2Var(iLit), uSupp );
            else
            {
                pTruthFans[i] = NULL;
                nPartial = 1;
            }
    }
    else
    {
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            pTruthFans[i] = Kit_DsdTruthComputeNodeOne_rec( p, pNtk, Abc_Lit2Var(iLit), uSupp );
    }
    // create the truth table

    // simple gates
    if ( pObj->Type == KIT_DSD_AND )
    {
        Kit_TruthFill( pTruthRes, pNtk->nVars );
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            if ( pTruthFans[i] )
                Kit_TruthAndPhase( pTruthRes, pTruthRes, pTruthFans[i], pNtk->nVars, 0, Abc_LitIsCompl(iLit) );
        return pTruthRes;
    }
    if ( pObj->Type == KIT_DSD_XOR )
    {
        Kit_TruthClear( pTruthRes, pNtk->nVars );
        fCompl = 0;
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        {
            if ( pTruthFans[i] )
            {
                Kit_TruthXor( pTruthRes, pTruthRes, pTruthFans[i], pNtk->nVars );
                fCompl ^= Abc_LitIsCompl(iLit);
            }
        }
        if ( fCompl )
            Kit_TruthNot( pTruthRes, pTruthRes, pNtk->nVars );
        return pTruthRes;
    }
    assert( pObj->Type == KIT_DSD_PRIME );

    if ( uSupp && nPartial )
    {
        // find the only non-empty component
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            if ( pTruthFans[i] )
                break;
        assert( i < pObj->nFans );
        return pTruthFans[i];
    }
/*
    // get the truth table of the prime node
    pTruthPrime = Kit_DsdObjTruth( pObj );
    // get storage for the temporary minterm
    pTruthMint = Vec_PtrEntry(p->vTtNodes, pNtk->nVars + pNtk->nNodes);
    // go through the minterms
    nMints = (1 << pObj->nFans);
    Kit_TruthClear( pTruthRes, pNtk->nVars );
    for ( m = 0; m < nMints; m++ )
    {
        if ( !Kit_TruthHasBit(pTruthPrime, m) )
            continue;
        Kit_TruthFill( pTruthMint, pNtk->nVars );
        Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
            Kit_TruthAndPhase( pTruthMint, pTruthMint, pTruthFans[i], pNtk->nVars, 0, ((m & (1<<i)) == 0) ^ Abc_LitIsCompl(iLit) );
        Kit_TruthOr( pTruthRes, pTruthRes, pTruthMint, pNtk->nVars );
    }
*/
    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        if ( Abc_LitIsCompl(iLit) )
            Kit_TruthNot( pTruthFans[i], pTruthFans[i], pNtk->nVars );
    pTruthTemp = Kit_TruthCompose( p->dd, Kit_DsdObjTruth(pObj), pObj->nFans, pTruthFans, pNtk->nVars, p->vTtBdds, p->vNodes );
    Kit_TruthCopy( pTruthRes, pTruthTemp, pNtk->nVars );
    return pTruthRes;
}